

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_large_unittest.cc
# Opt level: O0

void TryAllocMightFail(size_t size)

{
  _func_void_ptr_unsigned_long *p_Var1;
  uchar *puVar2;
  ulong local_28;
  size_t i_1;
  size_t i;
  uchar *p;
  size_t size_local;
  
  p_Var1 = __noopt<void*(*)(unsigned_long)noexcept>_void_____unsigned_long_noexcept__(malloc);
  puVar2 = (uchar *)(*p_Var1)(size);
  if (puVar2 != (uchar *)0x0) {
    for (i_1 = 0; i_1 < 0x400; i_1 = i_1 + 1) {
      puVar2[i_1 * (size >> 10)] = (uchar)i_1;
    }
    for (local_28 = 0; local_28 < 0x400; local_28 = local_28 + 1) {
      if ((uint)puVar2[local_28 * (size >> 10)] != ((uint)local_28 & 0xff)) {
        syscall(1,2,"Check failed: p[i * (size / kPoints)] == static_cast<unsigned char>(i)\n",0x47)
        ;
        abort();
      }
    }
    puVar2[size - 1] = 'M';
    if (puVar2[size - 1] != 'M') {
      syscall(1,2,"Check failed: p[size-1] == \'M\'\n",0x1f);
      abort();
    }
  }
  puVar2 = noopt<unsigned_char*>(puVar2);
  free(puVar2);
  return;
}

Assistant:

void TryAllocMightFail(size_t size) {
  unsigned char* p = static_cast<unsigned char*>(noopt(malloc)(size));
  if (p != nullptr) {
    static const size_t kPoints = 1024;

    for ( size_t i = 0; i < kPoints; ++i ) {
      p[i * (size / kPoints)] = static_cast<unsigned char>(i);
    }

    for ( size_t i = 0; i < kPoints; ++i ) {
      CHECK(p[i * (size / kPoints)] == static_cast<unsigned char>(i));
    }

    p[size-1] = 'M';
    CHECK(p[size-1] == 'M');
  }

  free(noopt(p));
}